

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_canonicalized_decoding_transform.h
# Opt level: O3

Point2 __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::ComputeOriginalValue
          (PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *this,Point2 *pred,
          Point2 *corr)

{
  int *t;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  int *in_RCX;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int32_t iVar11;
  
  iVar1 = pred[2].v_._M_elems[0];
  iVar6 = (corr->v_)._M_elems[0] - iVar1;
  t = (corr->v_)._M_elems + 1;
  iVar9 = (corr->v_)._M_elems[1] - iVar1;
  (corr->v_)._M_elems[0] = iVar6;
  iVar3 = -iVar6;
  if (0 < iVar6) {
    iVar3 = iVar6;
  }
  iVar4 = -iVar9;
  if (0 < iVar9) {
    iVar4 = iVar9;
  }
  (corr->v_)._M_elems[1] = iVar9;
  uVar2 = pred[2].v_._M_elems[0];
  if (uVar2 < (uint)(iVar4 + iVar3)) {
    OctahedronToolBox::InvertDiamond((OctahedronToolBox *)pred,(int32_t *)corr,t);
    iVar6 = (corr->v_)._M_elems[0];
  }
  if (iVar6 == 0) {
    iVar9 = *t;
    if (iVar9 == 0) {
      bVar5 = true;
      iVar9 = 0;
      iVar6 = 0;
      iVar8 = 0;
      goto LAB_0016681b;
    }
    if (iVar9 < 1) goto LAB_001667e4;
LAB_001667fc:
    iVar10 = -iVar9;
    iVar8 = 3;
    iVar9 = iVar6;
  }
  else {
    iVar9 = *t;
    if (iVar6 < 0) {
      if (iVar9 < 1) {
        iVar8 = (uint)(0 < iVar9) * 3;
        bVar5 = true;
        goto LAB_0016681b;
      }
      goto LAB_001667fc;
    }
    if (iVar9 < 0) {
LAB_001667e4:
      iVar8 = 1;
      iVar10 = iVar9;
      iVar9 = -iVar6;
    }
    else {
      iVar8 = 2;
      iVar10 = -iVar6;
      iVar9 = -iVar9;
    }
  }
  *(ulong *)(corr->v_)._M_elems = CONCAT44(iVar9,iVar10);
  bVar5 = false;
  iVar6 = iVar10;
LAB_0016681b:
  iVar6 = iVar6 + *in_RCX;
  iVar10 = pred[2].v_._M_elems[0];
  if (iVar10 < iVar6) {
    iVar6 = iVar6 - (pred->v_)._M_elems[1];
  }
  else if (SBORROW4(iVar6,-iVar10) != iVar6 + iVar10 < 0) {
    iVar6 = iVar6 + (pred->v_)._M_elems[1];
  }
  iVar11 = iVar9 + in_RCX[1];
  if (iVar10 < iVar11) {
    iVar11 = iVar11 - (pred->v_)._M_elems[1];
  }
  else if (SBORROW4(iVar11,-iVar10) != iVar11 + iVar10 < 0) {
    iVar11 = iVar11 + (pred->v_)._M_elems[1];
  }
  (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
  super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.quantization_bits_ =
       iVar6;
  (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
  super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.max_quantized_value_
       = iVar11;
  if (!bVar5) {
    uVar7 = -iVar8;
    if (4U - iVar8 < 4) {
      uVar7 = 4U - iVar8;
    }
    if (uVar7 == 3) {
      iVar9 = -iVar11;
      iVar11 = iVar6;
    }
    else if (uVar7 == 2) {
      iVar11 = -iVar11;
      iVar9 = -iVar6;
    }
    else {
      iVar9 = iVar6;
      if (uVar7 == 1) {
        iVar9 = iVar11;
        iVar11 = -iVar6;
      }
    }
    iVar6 = iVar9;
    (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
    super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.quantization_bits_
         = iVar6;
    (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
    super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
    max_quantized_value_ = iVar11;
  }
  if (uVar2 < (uint)(iVar4 + iVar3)) {
    OctahedronToolBox::InvertDiamond
              ((OctahedronToolBox *)pred,(int32_t *)this,
               &(this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
                super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
                max_quantized_value_);
    iVar6 = (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
            super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
            quantization_bits_;
    iVar11 = (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
             super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
             max_quantized_value_;
  }
  (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
  super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.quantization_bits_ =
       iVar6 + iVar1;
  (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
  super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.max_quantized_value_
       = iVar11 + iVar1;
  return (Point2)(array<int,_2UL>)this;
}

Assistant:

Point2 ComputeOriginalValue(Point2 pred, Point2 corr) const {
    const Point2 t(this->center_value(), this->center_value());
    pred = pred - t;
    const bool pred_is_in_diamond = this->IsInDiamond(pred[0], pred[1]);
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&pred[0], &pred[1]);
    }
    const bool pred_is_in_bottom_left = this->IsInBottomLeft(pred);
    const int32_t rotation_count = this->GetRotationCount(pred);
    if (!pred_is_in_bottom_left) {
      pred = this->RotatePoint(pred, rotation_count);
    }
    Point2 orig(this->ModMax(AddAsUnsigned(pred[0], corr[0])),
                this->ModMax(AddAsUnsigned(pred[1], corr[1])));
    if (!pred_is_in_bottom_left) {
      const int32_t reverse_rotation_count = (4 - rotation_count) % 4;
      orig = this->RotatePoint(orig, reverse_rotation_count);
    }
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&orig[0], &orig[1]);
    }
    orig = orig + t;
    return orig;
  }